

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::~call_matcher
          (call_matcher<void_(),_std::tuple<>_> *this)

{
  bool bVar1;
  char *in_RSI;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> uStack_18;
  
  (this->super_call_matcher_base<void_()>).super_list_elem<trompeloeil::call_matcher_base<void_()>_>
  ._vptr_list_elem = (_func_int **)&PTR__call_matcher_0017de68;
  (this->super_expectation)._vptr_expectation = (_func_int **)&DAT_0017ded0;
  get_lock<void>();
  bVar1 = is_unfulfilled(this);
  if (bVar1) {
    in_RSI = "Unfulfilled expectation";
    report_missed(this,"Unfulfilled expectation");
  }
  list_elem<trompeloeil::call_matcher_base<void_()>_>::unlink
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this,in_RSI);
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_18);
  Catch::clara::std::
  unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
  ::~unique_ptr(&this->sequences);
  Catch::clara::std::
  unique_ptr<trompeloeil::return_handler<void_()>,_std::default_delete<trompeloeil::return_handler<void_()>_>_>
  ::~unique_ptr(&this->return_handler_obj);
  list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::~list(&this->actions);
  list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::~list(&this->conditions)
  ;
  list_elem<trompeloeil::call_matcher_base<void_()>_>::~list_elem
            ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
  return;
}

Assistant:

~call_matcher() override
    {
      auto lock = get_lock();
      if (is_unfulfilled())
      {
        report_missed("Unfulfilled expectation");
      }
      this->unlink();
    }